

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseObjectRemainder
          (Token *__return_storage_ptr__,Parser *this,AST **obj,Token *tok)

{
  _List_node_base *p_Var1;
  Allocator *pAVar2;
  bool bVar3;
  uint uVar4;
  Token *pTVar6;
  AST *msg;
  pointer pFVar7;
  iterator iVar8;
  AST *pAVar9;
  long lVar10;
  Object *pOVar11;
  pointer pOVar12;
  ObjectComprehension *pOVar13;
  StaticError *pSVar14;
  string *while_;
  _Alloc_hider _Var15;
  pointer pOVar16;
  int iVar17;
  int iVar18;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar19;
  bool got_comma;
  bool plus_sugar;
  bool is_method;
  bool meth_comma;
  Kind kind;
  AST *expr1;
  Hide field_hide;
  Fodder fodder1;
  Fodder fodder_r;
  Fodder fodder_l;
  Fodder fodder2;
  Identifier *id;
  int local_48c;
  ArgParams params;
  ObjectFields fields;
  AST *body;
  Token next;
  Fodder comma_fodder;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  specs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [3];
  LocationRange local_2d8;
  Token op;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_170;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  binds;
  LocationRange idLocation;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  literal_fields;
  ulong uVar5;
  
  fields.
  super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &literal_fields._M_t._M_impl.super__Rb_tree_header._M_header;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &binds._M_t._M_impl.super__Rb_tree_header._M_header;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fields.
  super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  got_comma = false;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       binds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pop(&next,this);
  bVar3 = true;
  do {
    while_ = (string *)(ulong)next.kind;
    if (next.kind == FOR) {
      pOVar12 = (pointer)0x0;
      iVar18 = 0;
      iVar17 = 0;
      for (pOVar16 = fields.
                     super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pOVar16 !=
          fields.
          super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
          ._M_impl.super__Vector_impl_data._M_finish; pOVar16 = pOVar16 + 1) {
        if (pOVar16->kind != LOCAL) {
          if (pOVar16->kind == ASSERT) {
            iVar18 = iVar18 + 1;
          }
          else {
            iVar17 = iVar17 + 1;
            pOVar12 = pOVar16;
          }
        }
      }
      if (iVar18 != 0) {
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&op,"object comprehension cannot have asserts.",
                   (allocator<char> *)&specs);
        StaticError::StaticError(pSVar14,&next.location,(string *)&op);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if (iVar17 != 1) {
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&op,"object comprehension can only have one field.",
                   (allocator<char> *)&specs);
        StaticError::StaticError(pSVar14,&next.location,(string *)&op);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if (pOVar12->hide != INHERIT) {
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&op,"object comprehensions cannot have hidden fields.",
                   (allocator<char> *)&specs);
        StaticError::StaticError(pSVar14,&next.location,(string *)&op);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if (pOVar12->kind != FIELD_EXPR) {
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&op,"object comprehensions can only have [e] fields.",
                   (allocator<char> *)&specs);
        StaticError::StaticError(pSVar14,&next.location,(string *)&op);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      }
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector(&local_170,&next.fodder);
      parseComprehensionSpecs(__return_storage_ptr__,this,BRACE_R,&local_170,&specs);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_170);
      pAVar2 = this->alloc;
      span((LocationRange *)&op,tok,__return_storage_ptr__);
      pOVar13 = Allocator::
                make<jsonnet::internal::ObjectComprehension,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,bool&,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                          (pAVar2,(LocationRange *)&op,&tok->fodder,&fields,&got_comma,&specs,
                           &__return_storage_ptr__->fodder);
      *obj = &pOVar13->super_AST;
      std::__cxx11::string::~string((string *)&op);
      std::
      vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ::~vector(&specs);
LAB_0016560b:
      Token::~Token(&next);
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree(&binds._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&literal_fields._M_t);
      std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
      ~vector(&fields);
      return __return_storage_ptr__;
    }
    if (next.kind == BRACE_R) {
      pAVar2 = this->alloc;
      span((LocationRange *)&op,tok,&next);
      pOVar11 = Allocator::
                make<jsonnet::internal::Object,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                          (pAVar2,(LocationRange *)&op,&tok->fodder,&fields,&got_comma,&next.fodder)
      ;
      *obj = &pOVar11->super_AST;
      std::__cxx11::string::~string((string *)&op);
      Token::Token(__return_storage_ptr__,&next);
      goto LAB_0016560b;
    }
    if (!bVar3 && (got_comma & 1U) == 0) {
      pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&op,"expected a comma before next field.",(allocator<char> *)&specs);
      StaticError::StaticError(pSVar14,&next.location,(string *)&op);
      __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
    }
    got_comma = false;
    uVar4 = next.kind - IDENTIFIER;
    uVar5 = (ulong)uVar4;
    if (uVar4 < 0x14) {
      while_ = (string *)
               ((long)&switchD_00164a56::switchdataD_001e20c8 +
               (long)(int)(&switchD_00164a56::switchdataD_001e20c8)[uVar5]);
      switch(uVar5) {
      case 0:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
        goto switchD_00164a56_caseD_0;
      default:
switchD_00164a56_caseD_1:
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&op,"parsing field definition",(allocator<char> *)&specs);
        unexpected(pSVar14,(Parser *)&next,&op,while_);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      case 8:
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&specs,&next.fodder);
        pAVar9 = parse(this,0xf);
        idLocation.file._M_dataplus._M_p = (pointer)0x0;
        idLocation.file._M_string_length = 0;
        idLocation.file.field_2._M_allocated_capacity = 0;
        p_Var1 = (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if ((*(int *)&p_Var1[1]._M_next == 0xc) &&
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var1 + 3),":"), bVar3)) {
          pop(&op,this);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)&idLocation,&op.fodder);
          msg = parse(this,0xf);
          Token::~Token(&op);
        }
        else {
          msg = (AST *)0x0;
        }
        fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pop(&op,this);
        Token::operator=(&next,&op);
        Token::~Token(&op);
        if (next.kind == COMMA) {
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&fodder1,&next.fodder);
          pop(&op,this);
          Token::operator=(&next,&op);
          Token::~Token(&op);
          got_comma = true;
        }
        ObjectField::Assert((ObjectField *)&op,(Fodder *)&specs,pAVar9,(Fodder *)&idLocation,msg,
                            &fodder1);
        std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
        ::emplace_back<jsonnet::internal::ObjectField>(&fields,(ObjectField *)&op);
        ObjectField::~ObjectField((ObjectField *)&op);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&fodder1);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&idLocation);
        pTVar6 = (Token *)&specs;
        break;
      case 0x13:
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector(&fodder1,&next.fodder);
        popExpect((Token *)&specs,this,IDENTIFIER,(char *)0x0);
        pAVar2 = this->alloc;
        Token::data32_abi_cxx11_((UString *)&op,(Token *)&specs);
        pFVar7 = (pointer)Allocator::makeIdentifier(pAVar2,(UString *)&op);
        std::__cxx11::u32string::~u32string((u32string *)&op);
        comma_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = pFVar7;
        iVar8 = std::
                _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                ::find(&binds._M_t,(key_type *)&comma_fodder);
        if ((_Rb_tree_header *)iVar8._M_node != &binds._M_t._M_impl.super__Rb_tree_header) {
          pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op,
                         "duplicate local var: ",local_338);
          StaticError::StaticError(pSVar14,&local_2d8,(string *)&op);
          __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
        }
        expr1 = (AST *)((ulong)expr1 & 0xffffffffffffff00);
        fodder2.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder2.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fodder2.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        params.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        params.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        params.
        super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fodder_l.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder_l.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fodder_l.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48c = *(int *)&(this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
        if (local_48c == 7) {
          pop(&op,this);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)&params,&op.fodder);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&idLocation,"function parameter",(allocator<char> *)&id);
          parseParams((ArgParams *)&fodder_r,this,&idLocation.file,(bool *)&expr1,&fodder_l);
          std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          _M_move_assign((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                          *)&fodder2,(ArgParams *)&fodder_r);
          std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector((ArgParams *)&fodder_r);
          std::__cxx11::string::~string((string *)&idLocation);
          Token::~Token(&op);
        }
        popExpect((Token *)&idLocation,this,OPERATOR,"=");
        pAVar9 = parse(this,0xf);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)&binds,(Identifier **)&comma_fodder);
        fodder_r.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder_r.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fodder_r.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pop(&op,this);
        Token::operator=(&next,&op);
        Token::~Token(&op);
        if (next.kind == COMMA) {
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&fodder_r,&next.fodder);
          pop(&op,this);
          Token::operator=(&next,&op);
          Token::~Token(&op);
          got_comma = true;
        }
        ObjectField::Local((ObjectField *)&op,&fodder1,
                           (Fodder *)
                           &specs.
                            super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Fodder *)&params,&fodder_l,
                           local_48c == 7,
                           (Identifier *)
                           comma_fodder.
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           ._M_impl.super__Vector_impl_data._M_start,(ArgParams *)&fodder2,
                           SUB81(expr1,0),(Fodder *)&idLocation.file._M_string_length,pAVar9,
                           &fodder_r);
        std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
        ::emplace_back<jsonnet::internal::ObjectField>(&fields,(ObjectField *)&op);
        ObjectField::~ObjectField((ObjectField *)&op);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&fodder_r);
        Token::~Token((Token *)&idLocation);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&fodder_l);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&params);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )&fodder2);
        Token::~Token((Token *)&specs);
        pTVar6 = (Token *)&fodder1;
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)pTVar6);
      bVar3 = false;
    }
    else {
      if (next.kind != BRACKET_L) goto switchD_00164a56_caseD_1;
switchD_00164a56_caseD_0:
      expr1 = (AST *)0x0;
      id = (Identifier *)0x0;
      fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder2.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder2.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder2.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      idLocation.file._M_dataplus._M_p = (pointer)&idLocation.file.field_2;
      idLocation.file._M_string_length = 0;
      idLocation.file.field_2._M_allocated_capacity =
           idLocation.file.field_2._M_allocated_capacity & 0xffffffffffffff00;
      idLocation.end.line = 0;
      idLocation.end.column = 0;
      idLocation.begin.line = 0;
      idLocation.begin.column = 0;
      if (uVar4 < 8) {
        pTVar6 = (Token *)(*(code *)(&DAT_001e2118 + *(int *)(&DAT_001e2118 + uVar5 * 4)))();
        return pTVar6;
      }
      kind = FIELD_EXPR;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&fodder1,&next.fodder);
      expr1 = parse(this,0xf);
      popExpect(&op,this,BRACKET_R,(char *)0x0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&fodder2,&op.fodder);
      Token::~Token(&op);
      is_method = false;
      meth_comma = false;
      params.
      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      params.
      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      params.
      super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 7) {
        pop(&op,this);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&fodder_l,&op.fodder);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&specs,"method parameter",(allocator<char> *)&body);
        parseParams((ArgParams *)&comma_fodder,this,(string *)&specs,&meth_comma,&fodder_r);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        _M_move_assign(&params,(ArgParams *)&comma_fodder);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((ArgParams *)&comma_fodder);
        std::__cxx11::string::~string((string *)&specs);
        is_method = true;
        Token::~Token(&op);
      }
      plus_sugar = false;
      popExpect(&op,this,OPERATOR,(char *)0x0);
      _Var15 = op.data._M_dataplus;
      if (*op.data._M_dataplus._M_p == '+') {
        plus_sugar = true;
        _Var15._M_p = op.data._M_dataplus._M_p + 1;
      }
      for (lVar10 = 0; _Var15._M_p[lVar10] == ':'; lVar10 = lVar10 + 1) {
      }
      if (_Var15._M_p[lVar10] != '\0') {
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs,
                       "expected one of :, ::, :::, +:, +::, +:::, got: ",&op.data);
        StaticError::StaticError(pSVar14,&next.location,(string *)&specs);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      }
      iVar17 = (int)lVar10;
      if (iVar17 == 3) {
        field_hide = VISIBLE;
      }
      else if (iVar17 == 2) {
        field_hide = HIDDEN;
      }
      else {
        if (iVar17 != 1) {
          pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs
                         ,"expected one of :, ::, :::, +:, +::, +:::, got: ",&op.data);
          StaticError::StaticError(pSVar14,&next.location,(string *)&specs);
          __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
        }
        field_hide = INHERIT;
      }
      if ((is_method == true) && (plus_sugar == true)) {
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs,
                       "cannot use +: syntax sugar in a method: ",&next.data);
        StaticError::StaticError(pSVar14,&next.location,(string *)&specs);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if ((kind != FIELD_EXPR) &&
         (pVar19 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&literal_fields,&next.data),
         ((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
        pSVar14 = (StaticError *)__cxa_allocate_exception(0x60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs,
                       "duplicate field: ",&next.data);
        StaticError::StaticError(pSVar14,&next.location,(string *)&specs);
        __cxa_throw(pSVar14,&StaticError::typeinfo,StaticError::~StaticError);
      }
      body = parse(this,0xf);
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pop((Token *)&specs,this);
      Token::operator=(&next,(Token *)&specs);
      Token::~Token((Token *)&specs);
      if (next.kind == COMMA) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&comma_fodder,&next.fodder);
        pop((Token *)&specs,this);
        Token::operator=(&next,(Token *)&specs);
        Token::~Token((Token *)&specs);
        got_comma = true;
      }
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>::
      emplace_back<jsonnet::internal::ObjectField::Kind&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::ObjectField::Hide&,bool&,bool&,jsonnet::internal::AST*&,jsonnet::internal::Identifier_const*&,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>
                  *)&fields,&kind,&fodder1,&fodder2,&fodder_l,&fodder_r,&field_hide,&plus_sugar,
                 &is_method,&expr1,&id,&idLocation,&params,&meth_comma,&op.fodder,&body,
                 (void **)&specs,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&comma_fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&comma_fodder);
      Token::~Token(&op);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_r);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_l);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector(&params);
      std::__cxx11::string::~string((string *)&idLocation);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder2);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder1);
      bVar3 = false;
    }
  } while( true );
}

Assistant:

Token parseObjectRemainder(AST *&obj, const Token &tok)
    {
        ObjectFields fields;
        std::set<std::string> literal_fields;  // For duplicate fields detection.
        std::set<const Identifier *> binds;    // For duplicate locals detection.

        bool got_comma = false;
        bool first = true;
        Token next = pop();

        do {
            if (next.kind == Token::BRACE_R) {
                obj = alloc->make<Object>(
                    span(tok, next), tok.fodder, fields, got_comma, next.fodder);
                return next;

            } else if (next.kind == Token::FOR) {
                // It's a comprehension
                unsigned num_fields = 0;
                unsigned num_asserts = 0;
                const ObjectField *field_ptr = nullptr;
                for (const auto &field : fields) {
                    if (field.kind == ObjectField::LOCAL)
                        continue;
                    if (field.kind == ObjectField::ASSERT) {
                        num_asserts++;
                        continue;
                    }
                    field_ptr = &field;
                    num_fields++;
                }
                if (num_asserts > 0) {
                    auto msg = "object comprehension cannot have asserts.";
                    throw StaticError(next.location, msg);
                }
                if (num_fields != 1) {
                    auto msg = "object comprehension can only have one field.";
                    throw StaticError(next.location, msg);
                }
                const ObjectField &field = *field_ptr;

                if (field.hide != ObjectField::INHERIT) {
                    auto msg = "object comprehensions cannot have hidden fields.";
                    throw StaticError(next.location, msg);
                }

                if (field.kind != ObjectField::FIELD_EXPR) {
                    auto msg = "object comprehensions can only have [e] fields.";
                    throw StaticError(next.location, msg);
                }

                std::vector<ComprehensionSpec> specs;
                Token last = parseComprehensionSpecs(Token::BRACE_R, next.fodder, specs);
                obj = alloc->make<ObjectComprehension>(
                    span(tok, last), tok.fodder, fields, got_comma, specs, last.fodder);

                return last;
            }

            if (!got_comma && !first)
                throw StaticError(next.location, "expected a comma before next field.");

            first = false;
            got_comma = false;

            switch (next.kind) {
                case Token::BRACKET_L:
                case Token::IDENTIFIER:
                case Token::STRING_DOUBLE:
                case Token::STRING_SINGLE:
                case Token::STRING_BLOCK:
                case Token::VERBATIM_STRING_DOUBLE:
                case Token::VERBATIM_STRING_SINGLE: {
                    ObjectField::Kind kind;
                    AST *expr1 = nullptr;
                    const Identifier *id = nullptr;
                    Fodder fodder1, fodder2;
                    LocationRange idLocation;
                    if (next.kind == Token::IDENTIFIER) {
                        fodder1 = next.fodder;
                        kind = ObjectField::FIELD_ID;
                        id = alloc->makeIdentifier(next.data32());
                        idLocation = next.location;
                    } else if (next.kind == Token::STRING_DOUBLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::DOUBLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::STRING_SINGLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::SINGLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::STRING_BLOCK) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::BLOCK,
                                                           next.stringBlockIndent,
                                                           next.stringBlockTermIndent);
                    } else if (next.kind == Token::VERBATIM_STRING_SINGLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::VERBATIM_SINGLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::VERBATIM_STRING_DOUBLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::VERBATIM_DOUBLE,
                                                           "",
                                                           "");
                    } else {
                        kind = ObjectField::FIELD_EXPR;
                        fodder1 = next.fodder;
                        expr1 = parse(MAX_PRECEDENCE);
                        Token bracket_r = popExpect(Token::BRACKET_R);
                        fodder2 = bracket_r.fodder;
                    }

                    bool is_method = false;
                    bool meth_comma = false;
                    ArgParams params;
                    Fodder fodder_l;
                    Fodder fodder_r;
                    if (peek().kind == Token::PAREN_L) {
                        Token paren_l = pop();
                        fodder_l = paren_l.fodder;
                        params = parseParams("method parameter", meth_comma, fodder_r);
                        is_method = true;
                    }

                    bool plus_sugar = false;

                    Token op = popExpect(Token::OPERATOR);
                    const char *od = op.data.c_str();
                    if (*od == '+') {
                        plus_sugar = true;
                        od++;
                    }
                    unsigned colons = 0;
                    for (; *od != '\0'; ++od) {
                        if (*od != ':') {
                            throw StaticError(
                                next.location,
                                "expected one of :, ::, :::, +:, +::, +:::, got: " + op.data);
                        }
                        ++colons;
                    }
                    ObjectField::Hide field_hide;
                    switch (colons) {
                        case 1: field_hide = ObjectField::INHERIT; break;

                        case 2: field_hide = ObjectField::HIDDEN; break;

                        case 3: field_hide = ObjectField::VISIBLE; break;

                        default:
                            throw StaticError(
                                next.location,
                                "expected one of :, ::, :::, +:, +::, +:::, got: " + op.data);
                    }

                    // Basic checks for invalid Jsonnet code.
                    if (is_method && plus_sugar) {
                        throw StaticError(next.location,
                                          "cannot use +: syntax sugar in a method: " + next.data);
                    }
                    if (kind != ObjectField::FIELD_EXPR) {
                        if (!literal_fields.insert(next.data).second) {
                            throw StaticError(next.location, "duplicate field: " + next.data);
                        }
                    }

                    AST *body = parse(MAX_PRECEDENCE);

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.emplace_back(kind,
                                        fodder1,
                                        fodder2,
                                        fodder_l,
                                        fodder_r,
                                        field_hide,
                                        plus_sugar,
                                        is_method,
                                        expr1,
                                        id,
                                        idLocation,
                                        params,
                                        meth_comma,
                                        op.fodder,
                                        body,
                                        nullptr,
                                        comma_fodder);
                } break;

                case Token::LOCAL: {
                    Fodder local_fodder = next.fodder;
                    Token var_id = popExpect(Token::IDENTIFIER);
                    auto *id = alloc->makeIdentifier(var_id.data32());

                    if (binds.find(id) != binds.end()) {
                        throw StaticError(var_id.location, "duplicate local var: " + var_id.data);
                    }
                    bool is_method = false;
                    bool func_comma = false;
                    ArgParams params;
                    Fodder paren_l_fodder;
                    Fodder paren_r_fodder;
                    if (peek().kind == Token::PAREN_L) {
                        Token paren_l = pop();
                        paren_l_fodder = paren_l.fodder;
                        is_method = true;
                        params = parseParams("function parameter", func_comma, paren_r_fodder);
                    }
                    Token eq = popExpect(Token::OPERATOR, "=");
                    AST *body = parse(MAX_PRECEDENCE);
                    binds.insert(id);

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.push_back(ObjectField::Local(local_fodder,
                                                        var_id.fodder,
                                                        paren_l_fodder,
                                                        paren_r_fodder,
                                                        is_method,
                                                        id,
                                                        params,
                                                        func_comma,
                                                        eq.fodder,
                                                        body,
                                                        comma_fodder));

                } break;

                case Token::ASSERT: {
                    Fodder assert_fodder = next.fodder;
                    AST *cond = parse(MAX_PRECEDENCE);
                    AST *msg = nullptr;
                    Fodder colon_fodder;
                    if (peek().kind == Token::OPERATOR && peek().data == ":") {
                        Token colon = pop();
                        colon_fodder = colon.fodder;
                        msg = parse(MAX_PRECEDENCE);
                    }

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.push_back(
                        ObjectField::Assert(assert_fodder, cond, colon_fodder, msg, comma_fodder));
                } break;

                default: throw unexpected(next, "parsing field definition");
            }

        } while (true);
    }